

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_0::MergingIterator::FindSmallest(MergingIterator *this)

{
  IteratorWrapper *pIVar1;
  undefined8 *puVar2;
  IteratorWrapper *pIVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  IteratorWrapper *pIVar7;
  IteratorWrapper *pIVar8;
  long in_FS_OFFSET;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->n_ < 1) {
    pIVar8 = (IteratorWrapper *)0x0;
  }
  else {
    lVar6 = 0;
    lVar5 = 0;
    pIVar7 = (IteratorWrapper *)0x0;
    do {
      pIVar3 = this->children_;
      pIVar8 = pIVar7;
      if (((&pIVar3->valid_)[lVar6] == true) &&
         (pIVar1 = (IteratorWrapper *)((long)&pIVar3->iter_ + lVar6), pIVar8 = pIVar1,
         pIVar7 != (IteratorWrapper *)0x0)) {
        if ((&pIVar3->valid_)[lVar6] == false) {
LAB_00d45ac3:
          __assert_fail("Valid()",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/table/iterator_wrapper.h"
                        ,0x27,"Slice leveldb::IteratorWrapper::key() const");
        }
        puVar2 = (undefined8 *)((long)&(pIVar3->key_).data_ + lVar6);
        local_48 = *puVar2;
        uStack_40 = puVar2[1];
        if (pIVar7->valid_ == false) goto LAB_00d45ac3;
        local_58 = *(undefined4 *)&(pIVar7->key_).data_;
        uStack_54 = *(undefined4 *)((long)&(pIVar7->key_).data_ + 4);
        uStack_50 = (undefined4)(pIVar7->key_).size_;
        uStack_4c = *(undefined4 *)((long)&(pIVar7->key_).size_ + 4);
        iVar4 = (*this->comparator_->_vptr_Comparator[2])(this->comparator_,&local_48,&local_58);
        pIVar8 = pIVar7;
        if (iVar4 < 0) {
          pIVar8 = pIVar1;
        }
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x20;
      pIVar7 = pIVar8;
    } while (lVar5 < this->n_);
  }
  this->current_ = pIVar8;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void MergingIterator::FindSmallest() {
  IteratorWrapper* smallest = nullptr;
  for (int i = 0; i < n_; i++) {
    IteratorWrapper* child = &children_[i];
    if (child->Valid()) {
      if (smallest == nullptr) {
        smallest = child;
      } else if (comparator_->Compare(child->key(), smallest->key()) < 0) {
        smallest = child;
      }
    }
  }
  current_ = smallest;
}